

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

void __thiscall CLOptions::PrintHelp(CLOptions *this,string *executable_name)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
  *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
  *this_01;
  CLString *this_02;
  string *psVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
  *this_03;
  char cVar2;
  bool bVar3;
  uint uVar4;
  ostream *poVar5;
  undefined8 uVar6;
  pointer ppVar7;
  pointer ppVar8;
  pointer ppVar9;
  pointer ppVar10;
  undefined8 uVar11;
  CLOptions *this_04;
  CLOptions *pCVar12;
  CLOptions *this_05;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
  *this_06;
  undefined1 local_98 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  iterator str_itr;
  iterator int_itr;
  iterator dbl_itr;
  iterator bool_itr;
  
  pCVar12 = (CLOptions *)local_98;
  this_05 = (CLOptions *)local_98;
  this_02 = &this->version_opt;
  local_98._32_8_ = this;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  getParamName((string *)local_98,
               &this_02->
                super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              );
  cVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)local_98);
  if (cVar2 == '\0') {
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
             &this_02->
              super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            );
    poVar5 = std::operator<<((ostream *)&std::cout,(string *)local_98);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_98);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"\nUSAGE: ");
  poVar5 = std::operator<<(poVar5,(string *)executable_name);
  poVar5 = std::operator<<(poVar5," [options]");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  psVar1 = (string *)(local_98._32_8_ + 0x1f8);
  cVar2 = std::__cxx11::string::empty();
  if (cVar2 == '\0') {
    this_04 = (CLOptions *)&std::cout;
    std::operator<<((ostream *)&std::cout,"\nDESCRIPTION:\n");
    PrintDescription(this_04,psVar1,2);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"\nAVAILABLE OPTIONS:");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  puts("  -h, --help [no argument]");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_98,"Prints out this help information.",(allocator *)&local_70);
  PrintDescription(pCVar12,(string *)local_98,0xf);
  std::__cxx11::string::~string((string *)local_98);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_70);
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  getParamName((string *)local_98,
               &this_02->
                super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              );
  cVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)local_98);
  if (cVar2 == '\0') {
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getParamName((string *)local_98,
                 &this_02->
                  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
    uVar6 = std::__cxx11::string::c_str();
    printf("  -v, --%s [no argument]\n",uVar6);
    std::__cxx11::string::~string((string *)local_98);
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getDescription((string *)local_98,
                   &this_02->
                    super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  );
    PrintDescription(this_05,(string *)local_98,0xf);
    std::__cxx11::string::~string((string *)local_98);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
  ::_Rb_tree_iterator(&bool_itr);
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
             *)(local_98._32_8_ + 0x20);
  bool_itr = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
             ::begin(this_00);
  while( true ) {
    local_98._0_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
         ::end(this_00);
    bVar3 = std::operator!=(&bool_itr,(_Self *)local_98);
    if (!bVar3) break;
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
             ::operator->(&bool_itr);
    CLParam<bool>::getFullParamName_abi_cxx11_((string *)local_98,(CLParam<bool> *)ppVar7->second);
    uVar6 = std::__cxx11::string::c_str();
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
             ::operator->(&bool_itr);
    bVar3 = CLParam<bool>::getDefault((CLParam<bool> *)ppVar7->second);
    printf("  -%s [bool, default=%d]\n",uVar6,(ulong)bVar3);
    std::__cxx11::string::~string((string *)local_98);
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
             ::operator->(&bool_itr);
    pCVar12 = (CLOptions *)local_98;
    CLParam<bool>::getDescription_abi_cxx11_((string *)local_98,(CLParam<bool> *)ppVar7->second);
    PrintDescription(pCVar12,(string *)local_98,0xf);
    std::__cxx11::string::~string((string *)local_98);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
    ::operator++(&bool_itr);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
  ::_Rb_tree_iterator(&dbl_itr);
  this_01 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
             *)(local_98._32_8_ + 0x50);
  dbl_itr = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
            ::begin(this_01);
  while( true ) {
    local_98._0_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
         ::end(this_01);
    bVar3 = std::operator!=(&dbl_itr,(_Self *)local_98);
    if (!bVar3) break;
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
             ::operator->(&dbl_itr);
    CLParam<double>::getFullParamName_abi_cxx11_
              ((string *)local_98,&ppVar8->second->super_CLParam<double>);
    uVar6 = std::__cxx11::string::c_str();
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
             ::operator->(&dbl_itr);
    CLParam<double>::getDefault(&ppVar8->second->super_CLParam<double>);
    printf("  -%s [double, default=%f]\n",uVar6);
    std::__cxx11::string::~string((string *)local_98);
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
             ::operator->(&dbl_itr);
    pCVar12 = (CLOptions *)local_98;
    CLParam<double>::getDescription_abi_cxx11_
              ((string *)local_98,&ppVar8->second->super_CLParam<double>);
    PrintDescription(pCVar12,(string *)local_98,0xf);
    std::__cxx11::string::~string((string *)local_98);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
    ::operator++(&dbl_itr);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
  ::_Rb_tree_iterator(&int_itr);
  this_03 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
             *)(local_98._32_8_ + 0x80);
  int_itr = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
            ::begin(this_03);
  while( true ) {
    local_98._0_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
         ::end(this_03);
    bVar3 = std::operator!=(&int_itr,(_Self *)local_98);
    if (!bVar3) break;
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
             ::operator->(&int_itr);
    CLParam<int>::getFullParamName_abi_cxx11_((string *)local_98,(CLParam<int> *)ppVar9->second);
    uVar6 = std::__cxx11::string::c_str();
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
             ::operator->(&int_itr);
    uVar4 = CLParam<int>::getDefault((CLParam<int> *)ppVar9->second);
    printf("  -%s [int, default=%d]\n",uVar6,(ulong)uVar4);
    std::__cxx11::string::~string((string *)local_98);
    ppVar9 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
             ::operator->(&int_itr);
    pCVar12 = (CLOptions *)local_98;
    CLParam<int>::getDescription_abi_cxx11_((string *)local_98,(CLParam<int> *)ppVar9->second);
    PrintDescription(pCVar12,(string *)local_98,0xf);
    std::__cxx11::string::~string((string *)local_98);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
    ::operator++(&int_itr);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  ::_Rb_tree_iterator(&str_itr);
  this_06 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
             *)(local_98._32_8_ + 0xb0);
  str_itr = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
            ::begin(this_06);
  while( true ) {
    local_98._0_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
         ::end(this_06);
    bVar3 = std::operator!=(&str_itr,(_Self *)local_98);
    if (!bVar3) break;
    ppVar10 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
              ::operator->(&str_itr);
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getFullParamName((string *)local_98,
                     &ppVar10->second->
                      super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    );
    uVar6 = std::__cxx11::string::c_str();
    ppVar10 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
              ::operator->(&str_itr);
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getDefault(&local_70,
               &ppVar10->second->
                super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              );
    uVar11 = std::__cxx11::string::c_str();
    printf("  -%s [string, default=%s]\n",uVar6,uVar11);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)local_98);
    ppVar10 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
              ::operator->(&str_itr);
    pCVar12 = (CLOptions *)local_98;
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getDescription((string *)local_98,
                   &ppVar10->second->
                    super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  );
    PrintDescription(pCVar12,(string *)local_98,0xf);
    std::__cxx11::string::~string((string *)local_98);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
    ::operator++(&str_itr);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CLOptions::PrintHelp(const std::string& executable_name)
{
    // Print version if available
    if (!version_opt.getParamName().empty()) {
        std::cout << version_opt.getValue() << std::endl;
    }

    // Print usage information
    std::cout << "\nUSAGE: " << executable_name << " [options]" << std::endl;
    
    // Print the descripton of the program
    if (!program_desc_.empty()) {
        std::cout << "\nDESCRIPTION:\n" ;
        PrintDescription(program_desc_, 2) ;
    }
    
    std::cout << "\nAVAILABLE OPTIONS:" << std::endl;
    
    // Specify the help information
    std::printf("  -h, --help [no argument]\n") ;
    PrintDescription("Prints out this help information.") ;
    
    // Specify the version information
    if (!version_opt.getParamName().empty()) {
        std::printf("  -v, --%s [no argument]\n", version_opt.getParamName().c_str()) ;
        PrintDescription(version_opt.getDescription()) ;
    }
    
    // Loop through the parameters and print their current values
    
    // BOOLEANS
    std::map<std::string, CLBool*>::iterator bool_itr ;
    for (bool_itr=params_bools.begin(); bool_itr!=params_bools.end(); ++bool_itr) {
        std::printf("  -%s [bool, default=%d]\n",
                    bool_itr->second->getFullParamName().c_str(),
                    bool_itr->second->getDefault()) ;
        PrintDescription(bool_itr->second->getDescription()) ;
    }
    // DOUBLES
    std::map<std::string, CLDouble*>::iterator dbl_itr ;
    for (dbl_itr=params_doubles.begin(); dbl_itr!=params_doubles.end(); ++dbl_itr) {
        std::printf("  -%s [double, default=%f]\n",
                    dbl_itr->second->getFullParamName().c_str(),
                    dbl_itr->second->getDefault()) ;
        PrintDescription(dbl_itr->second->getDescription()) ;
    }
    // INTEGERS
    std::map<std::string, CLInt*>::iterator int_itr ;
    for (int_itr=params_ints.begin(); int_itr!=params_ints.end(); ++int_itr) {
        std::printf("  -%s [int, default=%d]\n",
                    int_itr->second->getFullParamName().c_str(),
                    int_itr->second->getDefault()) ;
        PrintDescription(int_itr->second->getDescription()) ;
    }
    // STRINGS
    std::map<std::string, CLString*>::iterator str_itr ;
    for (str_itr=params_strings.begin(); str_itr!=params_strings.end(); ++str_itr) {
        std::printf("  -%s [string, default=%s]\n",
                    str_itr->second->getFullParamName().c_str(),
                    str_itr->second->getDefault().c_str()) ;
        PrintDescription(str_itr->second->getDescription()) ;
    }
    std::cout << std::endl;
}